

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::TextureQueryInstance::setupDefaultInputs(TextureQueryInstance *this)

{
  undefined1 local_58 [8];
  float positions [16];
  deUint32 numVertices;
  TextureQueryInstance *this_local;
  
  positions[0xf] = 5.60519e-45;
  memcpy(local_58,&DAT_01355fd0,0x40);
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,local_58);
  return;
}

Assistant:

void TextureQueryInstance::setupDefaultInputs (void)
{
	const deUint32		numVertices		= 4;
	const float			positions[]		=
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f,
		 1.0f, -1.0f, 0.0f, 1.0f,
		 1.0f,  1.0f, 0.0f, 1.0f
	};

	addAttribute(0u, vk::VK_FORMAT_R32G32B32A32_SFLOAT, 4 * (deUint32)sizeof(float), numVertices, positions);
}